

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void idx2::Resize<int>(array<int> *Array,i64 NewSize)

{
  long lVar1;
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<int>(Array,NewSize);
  }
  lVar1 = Array->Size;
  if (lVar1 < NewSize) {
    memset((Array->Buffer).Data + lVar1 * 4,0,NewSize * 4 + lVar1 * -4);
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}